

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void send_ssi_file(mg_connection *conn,char *path,FILE *fp,int include_level)

{
  char *pcVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t buflen;
  int iVar8;
  bool bVar9;
  char *local_6048;
  int local_603c;
  char buf [8192];
  char local_4038 [8192];
  char file_name [8192];
  
  if (10 < include_level) {
    mg_printf(conn,"SSI #include level is too deep (%s)");
    return;
  }
  local_603c = include_level + 1;
  local_6048 = path;
LAB_0010a587:
  do {
    bVar9 = false;
    iVar4 = 0;
    do {
      while( true ) {
        while( true ) {
          iVar3 = fgetc((FILE *)fp);
          if (iVar3 == -1) {
            if (0 < iVar4) {
              mg_write(conn,buf,iVar4);
            }
            return;
          }
          if (iVar3 == 0x3e && bVar9) {
            (buf + iVar4)[0] = '>';
            (buf + iVar4)[1] = '\0';
            if (0x1fff < iVar4) {
              __assert_fail("len <= (int) sizeof(buf)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                            ,0x105b,
                            "void send_ssi_file(struct mg_connection *, const char *, FILE *, int)")
              ;
            }
            if ((iVar4 < 5) || (iVar3 = bcmp(buf,"<!--#",5), iVar3 != 0)) {
              iVar4 = iVar4 + 1;
              goto LAB_0010a6e7;
            }
            iVar4 = bcmp(buf + 5,"include",7);
            if (iVar4 != 0) {
              if (buf._5_4_ == 0x63657865) {
                do_ssi_exec(conn,buf + 9);
              }
              else {
                mg_printf(conn,"%s: unknown SSI command: \"%s\"",local_6048,buf);
              }
              goto LAB_0010a587;
            }
            pcVar1 = conn[1].request_method;
            pcVar7 = buf + 0xc;
            iVar4 = __isoc99_sscanf(pcVar7," virtual=\"%[^\"]\"",file_name);
            if (iVar4 == 1) {
              mg_snprintf(local_4038,0x2000,"%s%c%s",*(undefined8 *)(pcVar1 + 0x68),0x2f,file_name);
            }
            else {
              iVar4 = __isoc99_sscanf(pcVar7," abspath=\"%[^\"]\"",file_name);
              if (iVar4 == 1) {
                buflen = 0x2000;
                ppcVar2 = &local_6048;
              }
              else {
                iVar4 = __isoc99_sscanf(pcVar7," file=\"%[^\"]\"",file_name);
                if ((iVar4 != 1) &&
                   (iVar4 = __isoc99_sscanf(pcVar7," \"%[^\"]\"",file_name), iVar4 != 1)) {
                  mg_printf(conn,"Bad SSI #include: [%s]",pcVar7);
                  goto LAB_0010a587;
                }
                mg_snprintf(local_4038,0x2000,"%s",local_6048);
                pcVar7 = strrchr(local_4038,0x2f);
                if (pcVar7 != (char *)0x0) {
                  pcVar7[1] = '\0';
                }
                sVar5 = strlen(local_4038);
                ppcVar2 = (char **)((long)&local_6048 + sVar5);
                buflen = 0x2000 - sVar5;
              }
              mg_snprintf((char *)((long)ppcVar2 + 0x2010),buflen,"%s",file_name);
            }
            __stream = fopen64(local_4038,"rb");
            if (__stream == (FILE *)0x0) {
              piVar6 = __errno_location();
              pcVar7 = strerror(*piVar6);
              mg_printf(conn,"Cannot open SSI #include: [%s]: fopen(%s): %s",buf + 0xc,local_4038,
                        pcVar7);
            }
            else {
              iVar4 = fileno(__stream);
              ns_set_close_on_exec(iVar4);
              pcVar7 = *(char **)(pcVar1 + 0xb8);
              sVar5 = strlen(pcVar7);
              iVar4 = mg_match_prefix(pcVar7,(int)sVar5,local_4038);
              if (iVar4 < 1) {
                send_file_data(conn,(FILE *)__stream);
              }
              else {
                send_ssi_file(conn,local_4038,(FILE *)__stream,local_603c);
              }
              fclose(__stream);
            }
            goto LAB_0010a587;
          }
          if (!bVar9) break;
          if (iVar4 == 0x1ffe) {
            iVar4 = 0;
            mg_printf(conn,"%s: SSI tag is too large",local_6048);
            bVar9 = true;
          }
          else {
            bVar9 = true;
            if (iVar4 == 5) {
              iVar4 = bcmp(buf,"<!--#",5);
              bVar9 = iVar4 == 0;
              iVar4 = 5;
            }
          }
          buf[iVar4] = (char)iVar3;
          iVar4 = iVar4 + 1;
        }
        if (iVar3 != 0x3c) break;
        if (0 < iVar4) {
          mg_write(conn,buf,iVar4);
        }
        buf[0] = '<';
        bVar9 = true;
        iVar4 = 1;
      }
      iVar8 = iVar4 + 1;
      buf[iVar4] = (char)iVar3;
      bVar9 = false;
      iVar4 = iVar8;
    } while (iVar8 != 0x2000);
    iVar4 = 0x2000;
LAB_0010a6e7:
    mg_write(conn,buf,iVar4);
  } while( true );
}

Assistant:

static void send_ssi_file(struct mg_connection *conn, const char *path,
                          FILE *fp, int include_level) {
  char buf[IOBUF_SIZE];
  int ch, offset, len, in_ssi_tag;

  if (include_level > 10) {
    mg_printf(conn, "SSI #include level is too deep (%s)", path);
    return;
  }

  in_ssi_tag = len = offset = 0;
  while ((ch = fgetc(fp)) != EOF) {
    if (in_ssi_tag && ch == '>') {
      in_ssi_tag = 0;
      buf[len++] = (char) ch;
      buf[len] = '\0';
      assert(len <= (int) sizeof(buf));
      if (len < 6 || memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag, pass it
        (void) mg_write(conn, buf, (size_t) len);
      } else {
        if (!memcmp(buf + 5, "include", 7)) {
          do_ssi_include(conn, path, buf + 12, include_level);
#if !defined(MONGOOSE_NO_POPEN)
        } else if (!memcmp(buf + 5, "exec", 4)) {
          do_ssi_exec(conn, buf + 9);
#endif // !NO_POPEN
        } else {
          mg_printf(conn, "%s: unknown SSI " "command: \"%s\"", path, buf);
        }
      }
      len = 0;
    } else if (in_ssi_tag) {
      if (len == 5 && memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag
        in_ssi_tag = 0;
      } else if (len == (int) sizeof(buf) - 2) {
        mg_printf(conn, "%s: SSI tag is too large", path);
        len = 0;
      }
      buf[len++] = ch & 0xff;
    } else if (ch == '<') {
      in_ssi_tag = 1;
      if (len > 0) {
        mg_write(conn, buf, (size_t) len);
      }
      len = 0;
      buf[len++] = ch & 0xff;
    } else {
      buf[len++] = ch & 0xff;
      if (len == (int) sizeof(buf)) {
        mg_write(conn, buf, (size_t) len);
        len = 0;
      }
    }
  }

  // Send the rest of buffered data
  if (len > 0) {
    mg_write(conn, buf, (size_t) len);
  }
}